

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_write_compressed_img
              (fitsfile *fptr,int datatype,long *infpixel,long *inlpixel,int nullcheck,void *array,
              void *nullval,int *status)

{
  int iVar1;
  fitsfile *infptr;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *status_00;
  long lVar6;
  long lVar7;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int *in_stack_00000010;
  char card [81];
  char *bnullarray;
  void *buffer;
  int buffpixsiz;
  int tstatus;
  int tilenul;
  int pixlen;
  int ndim;
  int ii;
  long ntrows;
  long trowsize;
  long irow;
  long i0;
  long i1;
  long i2;
  long i3;
  long i4;
  long i5;
  long lpixel [6];
  long fpixel [6];
  long ntemp;
  long offset [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  long ltile [6];
  long ftile [6];
  long thistilesize [6];
  long tilesize [6];
  long naxis [6];
  int tiledim [6];
  fitsfile *in_stack_fffffffffffffc28;
  char *local_3a8;
  long local_3a0;
  long local_398;
  char *local_390;
  long *local_388;
  long *local_380;
  long local_378;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  uint local_360;
  int in_stack_fffffffffffffca4;
  fitsfile *in_stack_fffffffffffffca8;
  void *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  undefined8 uVar8;
  uint local_2e8;
  undefined4 in_stack_fffffffffffffd20;
  uint uVar9;
  int iVar10;
  int *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  int *in_stack_fffffffffffffd40;
  fitsfile *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  fitsfile *in_stack_fffffffffffffd58;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288 [3];
  long in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd98;
  void *in_stack_fffffffffffffda0;
  int *in_stack_fffffffffffffda8;
  long local_220;
  long alStack_1e8 [2];
  char *in_stack_fffffffffffffe28;
  long *in_stack_fffffffffffffe30;
  long *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int nullcheck_00;
  long local_158 [6];
  fitsfile *local_128;
  char *local_120;
  fitsfile *local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8 [6];
  char *local_98;
  long local_90;
  long local_88;
  char *local_80;
  long *local_78;
  long *local_70;
  int aiStack_68 [11];
  int local_3c;
  long local_38;
  long local_30;
  int local_24;
  int *local_20;
  int local_14;
  
  uVar8 = 0;
  if (*in_stack_00000010 < 1) {
    local_3c = in_R8D;
    local_38 = in_RCX;
    local_30 = in_RDX;
    local_24 = in_ESI;
    local_20 = in_RDI;
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffc28,(int *)0x1f1b4d);
    if (iVar1 == 0) {
      ffpmsg((char *)0x1f1b5e);
      *in_stack_00000010 = 0x19d;
      local_14 = 0x19d;
    }
    else {
      if (*local_20 == *(int *)(*(long *)(local_20 + 2) + 0x54)) {
        if ((*(long *)(*(long *)(local_20 + 2) + 0x88) == -1) &&
           (iVar1 = ffrdef((fitsfile *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                           ,in_stack_fffffffffffffd30), 0 < iVar1)) {
          return *in_stack_00000010;
        }
      }
      else {
        ffmahd(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
               (int *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (int *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
      }
      if ((local_24 == 0x15) || (local_24 == 0x14)) {
        uVar9 = 2;
      }
      else if ((local_24 == 0x1f) || (local_24 == 0x1e)) {
        uVar9 = 4;
      }
      else if ((local_24 == 0xb) || (local_24 == 0xc)) {
        uVar9 = 1;
      }
      else if ((local_24 == 0x29) || (local_24 == 0x28)) {
        uVar9 = 8;
      }
      else if (local_24 == 0x2a) {
        uVar9 = 4;
      }
      else {
        if (local_24 != 0x52) {
          ffpmsg((char *)0x1f1ccd);
          *in_stack_00000010 = 0x19a;
          return 0x19a;
        }
        uVar9 = 8;
      }
      local_2e8 = uVar9;
      if (*(int *)(*(long *)(local_20 + 2) + 0x43c) == 0x29) {
        if ((*(int *)(*(long *)(local_20 + 2) + 0x48c) == 8) ||
           (*(int *)(*(long *)(local_20 + 2) + 0x48c) == 0x10)) {
          if (uVar9 < 5) {
            local_2e8 = 4;
          }
        }
        else {
          local_2e8 = 8;
        }
      }
      else if (*(int *)(*(long *)(local_20 + 2) + 0x43c) == 0x1f) {
        local_360 = uVar9;
        if (uVar9 < 5) {
          local_360 = 4;
        }
        local_2e8 = local_360;
      }
      else {
        if ((((*(int *)(*(long *)(local_20 + 2) + 0x43c) != 0xb) &&
             (*(int *)(*(long *)(local_20 + 2) + 0x43c) != 0x15)) &&
            (*(int *)(*(long *)(local_20 + 2) + 0x43c) != 0x16)) &&
           (*(int *)(*(long *)(local_20 + 2) + 0x43c) != 0x33)) {
          ffpmsg((char *)0x1f1ee5);
          *in_stack_00000010 = 0x19a;
          return 0x19a;
        }
        if (*(int *)(*(long *)(local_20 + 2) + 0x48c) == 8) {
          if (uVar9 < 2) {
            local_2e8 = 1;
          }
        }
        else if (*(int *)(*(long *)(local_20 + 2) + 0x48c) == 0x10) {
          if (uVar9 < 3) {
            local_2e8 = 2;
          }
        }
        else if (uVar9 < 5) {
          local_2e8 = 4;
        }
      }
      infptr = (fitsfile *)calloc(*(size_t *)(*(long *)(local_20 + 2) + 0x4c8),(long)(int)local_2e8)
      ;
      if (infptr == (fitsfile *)0x0) {
        ffpmsg((char *)0x1f1f46);
        *in_stack_00000010 = 0x71;
        local_14 = 0x71;
      }
      else {
        for (iVar1 = 0; iVar1 < 6; iVar1 = iVar1 + 1) {
          (&local_98)[iVar1] = (char *)0x1;
          aiStack_68[iVar1] = 1;
          local_c8[iVar1] = 1;
          (&local_128)[iVar1] = (fitsfile *)0x1;
          local_158[iVar1] = 1;
          alStack_1e8[iVar1] = 1;
        }
        iVar1 = *(int *)(*(long *)(local_20 + 2) + 0x490);
        local_220 = 1;
        for (iVar10 = 0; iVar10 < iVar1; iVar10 = iVar10 + 1) {
          *(undefined8 *)(&stack0xfffffffffffffda8 + (long)iVar10 * 8) =
               *(undefined8 *)(local_30 + (long)iVar10 * 8);
          local_288[iVar10] = *(long *)(local_38 + (long)iVar10 * 8);
          (&local_98)[iVar10] = *(char **)(*(long *)(local_20 + 2) + 0x498 + (long)iVar10 * 8);
          if (*(long *)(&stack0xfffffffffffffda8 + (long)iVar10 * 8) < 1) {
            free(infptr);
            *in_stack_00000010 = 0x141;
            return 0x141;
          }
          local_c8[iVar10] = *(long *)(*(long *)(local_20 + 2) + 0x440 + (long)iVar10 * 8);
          aiStack_68[iVar10] = (int)((long)((&local_98)[iVar10] + -1) / local_c8[iVar10]) + 1;
          (&local_128)[iVar10] =
               (fitsfile *)
               ((*(long *)(&stack0xfffffffffffffda8 + (long)iVar10 * 8) + -1) / local_c8[iVar10] + 1
               );
          if ((local_288[iVar10] + -1) / local_c8[iVar10] + 1 < (long)aiStack_68[iVar10]) {
            local_378 = (local_288[iVar10] + -1) / local_c8[iVar10] + 1;
          }
          else {
            local_378 = (long)aiStack_68[iVar10];
          }
          local_158[iVar10] = local_378;
          alStack_1e8[iVar10] = local_220;
          local_220 = aiStack_68[iVar10] * local_220;
        }
        for (local_290 = local_100; local_290 <= local_158[5]; local_290 = local_290 + 1) {
          lVar2 = (local_290 + -1) * local_c8[5] + 1;
          if (lVar2 + local_c8[5] + -1 < (long)local_70) {
            local_380 = (long *)(lVar2 + local_c8[5] + -1);
          }
          else {
            local_380 = local_70;
          }
          local_d0 = (long)local_380 + (1 - lVar2);
          lVar2 = CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
          for (local_298 = local_108; local_298 <= local_158[4]; local_298 = local_298 + 1) {
            lVar3 = (local_298 + -1) * local_c8[4] + 1;
            if (lVar3 + local_c8[4] + -1 < (long)local_78) {
              local_388 = (long *)(lVar3 + local_c8[4] + -1);
            }
            else {
              local_388 = local_78;
            }
            local_d8 = local_d0 * ((long)local_388 + (1 - lVar3));
            lVar3 = (local_298 + -1) * (long)in_stack_fffffffffffffe38;
            for (local_2a0 = local_110; local_2a0 <= local_158[3]; local_2a0 = local_2a0 + 1) {
              lVar4 = (local_2a0 + -1) * local_c8[3] + 1;
              if (lVar4 + local_c8[3] + -1 < (long)local_80) {
                local_390 = (char *)(lVar4 + local_c8[3] + -1);
              }
              else {
                local_390 = local_80;
              }
              local_e0 = local_d8 * (long)(local_390 + (1 - lVar4));
              lVar4 = (local_2a0 + -1) * (long)in_stack_fffffffffffffe30;
              for (in_stack_fffffffffffffd58 = local_118;
                  (long)in_stack_fffffffffffffd58 <= local_158[2];
                  in_stack_fffffffffffffd58 =
                       (fitsfile *)((long)&in_stack_fffffffffffffd58->HDUposition + 1)) {
                lVar5 = (long)((long)&in_stack_fffffffffffffd58[-1].Fptr + 7) * local_c8[2] + 1;
                if (lVar5 + local_c8[2] + -1 < local_88) {
                  local_398 = lVar5 + local_c8[2] + -1;
                }
                else {
                  local_398 = local_88;
                }
                local_e8 = local_e0 * ((local_398 - lVar5) + 1);
                lVar5 = (long)((long)&in_stack_fffffffffffffd58[-1].Fptr + 7) *
                        (long)in_stack_fffffffffffffe28;
                for (in_stack_fffffffffffffd50 = local_120;
                    (long)in_stack_fffffffffffffd50 <= local_158[1];
                    in_stack_fffffffffffffd50 = in_stack_fffffffffffffd50 + 1) {
                  status_00 = (int *)((long)(in_stack_fffffffffffffd50 + -1) * local_c8[1] + 1);
                  if ((long)status_00 + local_c8[1] + -1 < local_90) {
                    local_3a0 = (long)status_00 + local_c8[1] + -1;
                  }
                  else {
                    local_3a0 = local_90;
                  }
                  local_f0 = local_e8 * ((local_3a0 - (long)status_00) + 1);
                  lVar6 = (long)(in_stack_fffffffffffffd50 + -1) * alStack_1e8[1];
                  for (in_stack_fffffffffffffd48 = local_128;
                      (long)in_stack_fffffffffffffd48 <= local_158[0];
                      in_stack_fffffffffffffd48 =
                           (fitsfile *)((long)&in_stack_fffffffffffffd48->HDUposition + 1)) {
                    lVar7 = (long)((long)&in_stack_fffffffffffffd48[-1].Fptr + 7) * local_c8[0] + 1;
                    if (lVar7 + local_c8[0] + -1 < (long)local_98) {
                      local_3a8 = (char *)(lVar7 + local_c8[0] + -1);
                    }
                    else {
                      local_3a8 = local_98;
                    }
                    local_f8 = local_f0 * (long)(local_3a8 + (1 - lVar7));
                    in_stack_fffffffffffffd40 =
                         (int *)((long)&in_stack_fffffffffffffd48->HDUposition +
                                lVar6 + lVar5 + lVar4 + lVar3 + (local_290 + -1) * lVar2);
                    imcomp_decompress_tile
                              (infptr,(int)((ulong)uVar8 >> 0x20),(int)uVar8,
                               in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                               in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                               ,in_stack_fffffffffffffd40,&in_stack_fffffffffffffd48->HDUposition);
                    nullcheck_00 = (int)lVar7;
                    if (*in_stack_00000010 == 0x19f) {
                      memset(infptr,0,(int)uVar9 * local_f8);
                      *in_stack_00000010 = 0;
                    }
                    imcomp_merge_overlap
                              (local_3a8,in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                               in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                               in_stack_fffffffffffffe28,local_390,local_388,local_380,nullcheck_00,
                               status_00);
                    fits_calc_tile_rows((long *)&stack0xfffffffffffffe48,
                                        (long *)&stack0xfffffffffffffe78,iVar1,
                                        (long *)&stack0xfffffffffffffd38,
                                        (long *)&stack0xfffffffffffffd30,in_stack_00000010);
                    imcomp_compress_tile
                              (in_stack_fffffffffffffd48,(long)in_stack_fffffffffffffd40,
                               in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30,
                               CONCAT44(iVar10,iVar1),CONCAT44(uVar9,in_stack_fffffffffffffd20),
                               in_stack_fffffffffffffd90,in_stack_fffffffffffffd98,
                               in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
                  }
                }
              }
            }
          }
        }
        free(infptr);
        if ((*(int *)(*(long *)(local_20 + 2) + 0x48c) < 0) && (local_3c != 0)) {
          ffgcrd(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                 (char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        }
        local_14 = *in_stack_00000010;
      }
    }
  }
  else {
    local_14 = *in_stack_00000010;
  }
  return local_14;
}

Assistant:

int fits_write_compressed_img(fitsfile *fptr,   /* I - FITS file pointer     */
            int  datatype,   /* I - datatype of the array to be written      */
            long  *infpixel, /* I - 'bottom left corner' of the subsection   */
            long  *inlpixel, /* I - 'top right corner' of the subsection     */
            int  nullcheck,  /* I - 0 for no null checking                   */
                             /*     1: pixels that are = nullval will be     */
                             /*     written with the FITS null pixel value   */
                             /*     (floating point arrays only)             */
            void *array,     /* I - array of values to be written            */
            void *nullval,   /* I - undefined pixel value                    */
            int  *status)    /* IO - error status                            */
/*
   Write a section of a compressed image.
*/
{
    int  tiledim[MAX_COMPRESS_DIM];
    long naxis[MAX_COMPRESS_DIM];
    long tilesize[MAX_COMPRESS_DIM], thistilesize[MAX_COMPRESS_DIM];
    long ftile[MAX_COMPRESS_DIM], ltile[MAX_COMPRESS_DIM];
    long tfpixel[MAX_COMPRESS_DIM], tlpixel[MAX_COMPRESS_DIM];
    long rowdim[MAX_COMPRESS_DIM], offset[MAX_COMPRESS_DIM],ntemp;
    long fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long i5, i4, i3, i2, i1, i0, irow, trowsize, ntrows;
    int ii, ndim, pixlen, tilenul;
    int  tstatus, buffpixsiz;
    void *buffer;
    char *bnullarray = 0, card[FLEN_CARD];

    if (*status > 0) 
        return(*status);

    if (!fits_is_compressed_image(fptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_write_compressed_img)");
        return(*status = DATA_COMPRESSION_ERR);
    }

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);


    /* ===================================================================== */


    if (datatype == TSHORT || datatype == TUSHORT)
    {
       pixlen = sizeof(short);
    }
    else if (datatype == TINT || datatype == TUINT)
    {
       pixlen = sizeof(int);
    }
    else if (datatype == TBYTE || datatype == TSBYTE)
    {
       pixlen = 1;
    }
    else if (datatype == TLONG || datatype == TULONG)
    {
       pixlen = sizeof(long);
    }
    else if (datatype == TFLOAT)
    {
       pixlen = sizeof(float);
    }
    else if (datatype == TDOUBLE)
    {
       pixlen = sizeof(double);
    }
    else
    {
        ffpmsg("unsupported datatype for compressing image");
        return(*status = BAD_DATATYPE);
    }

    /* ===================================================================== */

    /* allocate scratch space for processing one tile of the image */
    buffpixsiz = pixlen;  /* this is the minimum pixel size */
    
    if ( (fptr->Fptr)->compress_type == HCOMPRESS_1) { /* need 4 or 8 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG ||
	    (fptr->Fptr)->zbitpix == SHORT_IMG )
                buffpixsiz = maxvalue(buffpixsiz, 4);
        else
	        buffpixsiz = 8;
    }
    else if ( (fptr->Fptr)->compress_type == PLIO_1) { /* need 4 bytes per pixel */
                buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else if ( (fptr->Fptr)->compress_type == RICE_1  ||
              (fptr->Fptr)->compress_type == GZIP_1 ||
              (fptr->Fptr)->compress_type == GZIP_2 ||
              (fptr->Fptr)->compress_type == BZIP2_1) {  /* need 1, 2, or 4 bytes per pixel */
        if ((fptr->Fptr)->zbitpix == BYTE_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 1);
        else if ((fptr->Fptr)->zbitpix == SHORT_IMG)
            buffpixsiz = maxvalue(buffpixsiz, 2);
        else 
            buffpixsiz = maxvalue(buffpixsiz, 4);
    }
    else
    {
        ffpmsg("unsupported image compression algorithm");
        return(*status = BAD_DATATYPE);
    }
    
    /* cast to double to force alignment on 8-byte addresses */
    buffer = (double *) calloc ((fptr->Fptr)->maxtilelen, buffpixsiz);

    if (buffer == NULL)
    {
	    ffpmsg("Out of memory (fits_write_compress_img)");
	    return (*status = MEMORY_ALLOCATION);
    }

    /* ===================================================================== */

    /* initialize all the arrays */
    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxis[ii] = 1;
        tiledim[ii] = 1;
        tilesize[ii] = 1;
        ftile[ii] = 1;
        ltile[ii] = 1;
        rowdim[ii] = 1;
    }

    ndim = (fptr->Fptr)->zndim;
    ntemp = 1;
    for (ii = 0; ii < ndim; ii++)
    {
        fpixel[ii] = infpixel[ii];
        lpixel[ii] = inlpixel[ii];

        /* calc number of tiles in each dimension, and tile containing */
        /* the first and last pixel we want to read in each dimension  */
        naxis[ii] = (fptr->Fptr)->znaxis[ii];
        if (fpixel[ii] < 1)
        {
            free(buffer);
            return(*status = BAD_PIX_NUM);
        }

        tilesize[ii] = (fptr->Fptr)->tilesize[ii];
        tiledim[ii] = (naxis[ii] - 1) / tilesize[ii] + 1;
        ftile[ii]   = (fpixel[ii] - 1)   / tilesize[ii] + 1;
        ltile[ii]   = minvalue((lpixel[ii] - 1) / tilesize[ii] + 1, 
                                tiledim[ii]);
        rowdim[ii]  = ntemp;  /* total tiles in each dimension */
        ntemp *= tiledim[ii];
    }

    /* support up to 6 dimensions for now */
    /* tfpixel and tlpixel are the first and last image pixels */
    /* along each dimension of the compression tile */
    for (i5 = ftile[5]; i5 <= ltile[5]; i5++)
    {
     tfpixel[5] = (i5 - 1) * tilesize[5] + 1;
     tlpixel[5] = minvalue(tfpixel[5] + tilesize[5] - 1, 
                            naxis[5]);
     thistilesize[5] = tlpixel[5] - tfpixel[5] + 1;
     offset[5] = (i5 - 1) * rowdim[5];
     for (i4 = ftile[4]; i4 <= ltile[4]; i4++)
     {
      tfpixel[4] = (i4 - 1) * tilesize[4] + 1;
      tlpixel[4] = minvalue(tfpixel[4] + tilesize[4] - 1, 
                            naxis[4]);
      thistilesize[4] = thistilesize[5] * (tlpixel[4] - tfpixel[4] + 1);
      offset[4] = (i4 - 1) * rowdim[4] + offset[5];
      for (i3 = ftile[3]; i3 <= ltile[3]; i3++)
      {
        tfpixel[3] = (i3 - 1) * tilesize[3] + 1;
        tlpixel[3] = minvalue(tfpixel[3] + tilesize[3] - 1, 
                              naxis[3]);
        thistilesize[3] = thistilesize[4] * (tlpixel[3] - tfpixel[3] + 1);
        offset[3] = (i3 - 1) * rowdim[3] + offset[4];
        for (i2 = ftile[2]; i2 <= ltile[2]; i2++)
        {
          tfpixel[2] = (i2 - 1) * tilesize[2] + 1;
          tlpixel[2] = minvalue(tfpixel[2] + tilesize[2] - 1, 
                                naxis[2]);
          thistilesize[2] = thistilesize[3] * (tlpixel[2] - tfpixel[2] + 1);
          offset[2] = (i2 - 1) * rowdim[2] + offset[3];
          for (i1 = ftile[1]; i1 <= ltile[1]; i1++)
          {
            tfpixel[1] = (i1 - 1) * tilesize[1] + 1;
            tlpixel[1] = minvalue(tfpixel[1] + tilesize[1] - 1, 
                                  naxis[1]);
            thistilesize[1] = thistilesize[2] * (tlpixel[1] - tfpixel[1] + 1);
            offset[1] = (i1 - 1) * rowdim[1] + offset[2];
            for (i0 = ftile[0]; i0 <= ltile[0]; i0++)
            {
              tfpixel[0] = (i0 - 1) * tilesize[0] + 1;
              tlpixel[0] = minvalue(tfpixel[0] + tilesize[0] - 1, 
                                    naxis[0]);
              thistilesize[0] = thistilesize[1] * (tlpixel[0] - tfpixel[0] + 1);
              /* calculate row of table containing this tile */
              irow = i0 + offset[1];

              /* read and uncompress this row (tile) of the table */
              /* also do type conversion and undefined pixel substitution */
              /* at this point */
              imcomp_decompress_tile(fptr, irow, thistilesize[0],
                    datatype, nullcheck, nullval, buffer, bnullarray, &tilenul,
                     status);

              if (*status == NO_COMPRESSED_TILE)
              {
                   /* tile doesn't exist, so initialize to zero */
                   memset(buffer, 0, pixlen * thistilesize[0]);
                   *status = 0;
              }

              /* copy the intersecting pixels to this tile from the input */
              imcomp_merge_overlap(buffer, pixlen, ndim, tfpixel, tlpixel, 
                     bnullarray, array, fpixel, lpixel, nullcheck, status);
                     
             /* Collapse sizes of higher dimension tiles into 2 dimensional
                equivalents needed by the quantizing algorithms for
                floating point types */
              fits_calc_tile_rows(tlpixel, tfpixel, ndim, &trowsize,
                              &ntrows, status);

              /* compress the tile again, and write it back to the FITS file */
              imcomp_compress_tile (fptr, irow, datatype, buffer, 
                                    thistilesize[0],
				    trowsize,
				    ntrows,
				    nullcheck, nullval, 
				    status);
            }
          }
        }
      }
     }
    }
    free(buffer);
    

    if ((fptr->Fptr)->zbitpix < 0 && nullcheck != 0) { 
/*
     This is a floating point FITS image with possible null values.
     It is too messy to test if any null values are actually written, so 
     just assume so.  We need to make sure that the
     ZBLANK keyword is present in the compressed image header.  If it is not
     there then we need to insert the keyword. 
*/   
        tstatus = 0;
        ffgcrd(fptr, "ZBLANK", card, &tstatus);

	if (tstatus) {   /* have to insert the ZBLANK keyword */
           ffgcrd(fptr, "ZCMPTYPE", card, status);
           ffikyj(fptr, "ZBLANK", COMPRESS_NULL_VALUE, 
                "null value in the compressed integer array", status);
	
           /* set this value into the internal structure; it is used if */
	   /* the program reads back the values from the array */
	 
          (fptr->Fptr)->zblank = COMPRESS_NULL_VALUE;
          (fptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }  
    }  
    
    return(*status);
}